

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O3

void __thiscall leveldb::Table::ReadMeta(Table *this,Footer *footer)

{
  Rep *pRVar1;
  int iVar2;
  Block *this_00;
  Comparator *comparator;
  Iterator *pIVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t __n;
  ReadOptions opt;
  string key;
  BlockContents contents;
  ReadOptions local_80;
  char *local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  char local_60 [16];
  Slice local_50;
  BlockContents local_40;
  
  pRVar1 = this->rep_;
  if ((pRVar1->options).filter_policy != (FilterPolicy *)0x0) {
    local_80.verify_checksums = false;
    local_80.fill_cache = true;
    local_80.snapshot = (Snapshot *)0x0;
    if ((pRVar1->options).paranoid_checks == true) {
      local_80.verify_checksums = true;
      local_80.fill_cache = true;
    }
    local_40.data.data_ = "";
    local_40.data.size_ = 0;
    ReadBlock((leveldb *)&local_70,pRVar1->file,&local_80,&footer->metaindex_handle_,&local_40);
    if (local_70 == (char *)0x0) {
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&local_40);
      comparator = BytewiseComparator();
      pIVar3 = Block::NewIterator(this_00,comparator);
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"filter.","");
      (*((this->rep_->options).filter_policy)->_vptr_FilterPolicy[2])();
      std::__cxx11::string::append((char *)&local_70);
      local_50.data_ = local_70;
      (*pIVar3->_vptr_Iterator[5])(pIVar3);
      iVar2 = (*pIVar3->_vptr_Iterator[2])(pIVar3);
      if ((char)iVar2 != '\0') {
        iVar2 = (*pIVar3->_vptr_Iterator[8])(pIVar3);
        if ((__n == CONCAT44(uStack_64,uStack_68)) &&
           (iVar2 = bcmp((void *)CONCAT44(extraout_var,iVar2),local_70,__n), iVar2 == 0)) {
          iVar2 = (*pIVar3->_vptr_Iterator[9])(pIVar3);
          local_50.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
          ReadFilter(this,&local_50);
        }
      }
      (*pIVar3->_vptr_Iterator[1])(pIVar3);
      Block::~Block(this_00);
      operator_delete(this_00);
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
    }
    else {
      operator_delete__(local_70);
    }
  }
  return;
}

Assistant:

void Table::ReadMeta(const Footer& footer) {
  if (rep_->options.filter_policy == nullptr) {
    return;  // Do not need any metadata
  }

  // TODO(sanjay): Skip this if footer.metaindex_handle() size indicates
  // it is an empty block.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents contents;
  if (!ReadBlock(rep_->file, opt, footer.metaindex_handle(), &contents).ok()) {
    // Do not propagate errors since meta info is not needed for operation
    return;
  }
  Block* meta = new Block(contents);

  Iterator* iter = meta->NewIterator(BytewiseComparator());
  std::string key = "filter.";
  key.append(rep_->options.filter_policy->Name());
  iter->Seek(key);
  if (iter->Valid() && iter->key() == Slice(key)) {
    ReadFilter(iter->value());
  }
  delete iter;
  delete meta;
}